

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistoryTree.cpp
# Opt level: O0

void __thiscall
JointActionObservationHistoryTree::SetSuccessor
          (JointActionObservationHistoryTree *this,Index aI,Index oI,
          JointActionObservationHistoryTree *suc)

{
  bool bVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  JointActionObservationHistoryTree *oNode;
  TreeNode<JointActionObservationHistory> *in_stack_000001c0;
  LIndex in_stack_000001c8;
  TreeNode<JointActionObservationHistory> *in_stack_000001d0;
  JointActionObservationHistoryTree *in_stack_ffffffffffffffc0;
  LIndex in_stack_ffffffffffffffd0;
  TreeNode<JointActionObservationHistory> *in_stack_ffffffffffffffd8;
  
  if (*(int *)(in_RDI + 0x58) == 1) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_ESI,in_EDX),in_RCX);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  bVar1 = TreeNode<JointActionObservationHistory>::ExistsSuccessor
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (bVar1) {
    TreeNode<JointActionObservationHistory>::GetSuccessor
              ((TreeNode<JointActionObservationHistory> *)CONCAT44(in_ESI,in_EDX),(LIndex)in_RCX);
  }
  else {
    pvVar3 = operator_new(0x60);
    JointActionObservationHistoryTree(in_stack_ffffffffffffffc0,(aoh_t)((ulong)pvVar3 >> 0x20));
    TreeNode<JointActionObservationHistory>::SetSuccessor
              (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  TreeNode<JointActionObservationHistory>::SetSuccessor
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI,
        JointActionObservationHistoryTree* suc)
{
    if (_m_nodeType == O_SUC)
        throw E("Trying JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, JointActionObservationHistoryTree* suc)  on O_SUC node");

    //first see if necessary to create a new  intermediate node
    JointActionObservationHistoryTree* oNode; 
    if (this->TreeNode<JointActionObservationHistory>::ExistsSuccessor(aI))
        oNode = (JointActionObservationHistoryTree*)
            this->TreeNode<JointActionObservationHistory>::GetSuccessor(aI);
    else //we need to create an intermediate node
    {
        oNode = new JointActionObservationHistoryTree(O_SUC);
        //which is the aI'th successor of this node
        this->TreeNode<JointActionObservationHistory>::SetSuccessor(aI, oNode);
    }

    //let oNode point to the actual successor.
    //Note: SetSuccessor with 1 index should give no problem for O_SUC nodes
    oNode->TreeNode<JointActionObservationHistory>::SetSuccessor(oI, suc);
}